

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

void mpack_store_float(char *p,float value)

{
  anon_union_4_2_947300b0 v;
  float value_local;
  char *p_local;
  
  mpack_store_u32(p,(uint32_t)value);
  return;
}

Assistant:

MPACK_INLINE void mpack_store_float(char* p, float value) {
    MPACK_CHECK_FLOAT_ORDER();
    union {
        float f;
        uint32_t u;
    } v;
    v.f = value;
    mpack_store_u32(p, v.u);
}